

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImDrawCornerFlags rounding_corners;
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  ImGuiWindow *pIVar7;
  uint uVar8;
  ImGuiContext *g;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  ulong extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  ImRect IVar27;
  bool hovered;
  char local_111;
  float local_110;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 size_expected;
  float local_88;
  ImVec2 local_60;
  ImRect r_outer;
  ImVec2 pos;
  ImRect total_bb;
  undefined1 extraout_var_00 [56];
  undefined1 auVar21 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar23 [56];
  
  pIVar2 = GImGui;
  uVar9 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar9 & 0xffffffef;
  pIVar7 = pIVar2->CurrentWindow;
  pIVar7->WriteAccessed = true;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(pIVar7,label,(char *)0x0);
  fVar12 = 0.0;
  if ((flags & 0x20U) == 0) {
    fVar12 = GetFrameHeight();
  }
  IVar14 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88 = IVar14.x;
  fVar13 = CalcItemWidth();
  auVar15._8_8_ = extraout_XMM0_Qb;
  auVar15._0_4_ = IVar14.x;
  auVar15._4_4_ = IVar14.y;
  IVar14 = (pIVar7->DC).CursorPos;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = IVar14.x;
  auVar11._4_4_ = IVar14.y;
  fVar26 = 0.0;
  uVar8 = (flags & 0x40U) >> 6;
  bVar5 = SUB41(uVar8,0);
  auVar10._0_4_ = (float)(uVar8 * (int)fVar12 + (uint)!bVar5 * (int)fVar13);
  auVar10._4_12_ = extraout_var;
  fVar13 = (pIVar2->Style).FramePadding.y;
  auVar15 = vmovshdup_avx(auVar15);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar13),ZEXT416(0x40000000));
  auVar15 = vinsertps_avx(auVar10,auVar15,0x10);
  auVar24._0_4_ = auVar15._0_4_ + IVar14.x;
  auVar24._4_4_ = auVar15._4_4_ + IVar14.y;
  auVar24._8_4_ = auVar15._8_4_ + 0.0;
  auVar24._12_4_ = auVar15._12_4_ + 0.0;
  frame_bb = (ImRect)vmovlhps_avx(auVar11,auVar24);
  if (0.0 < local_88) {
    fVar26 = local_88 + (pIVar2->Style).ItemInnerSpacing.x;
  }
  auVar25._0_4_ = fVar26 + auVar24._0_4_;
  auVar25._4_4_ = auVar24._4_4_ + 0.0;
  auVar25._8_4_ = auVar24._8_4_ + 0.0;
  auVar25._12_4_ = auVar24._12_4_ + 0.0;
  total_bb = (ImRect)vmovlhps_avx(auVar11,auVar25);
  ItemSize(&total_bb,fVar13);
  bVar3 = ItemAdd(&total_bb,id,&frame_bb);
  if (!bVar3) {
    return false;
  }
  local_111 = ButtonBehavior(&frame_bb,id,&hovered,&held,0);
  bVar4 = IsPopupOpen(id);
  IVar6 = GetColorU32(hovered + 7,1.0);
  fVar13 = frame_bb.Min.x;
  auVar15 = ZEXT416((uint)frame_bb.Min.x);
  local_110 = frame_bb.Max.x;
  RenderNavHighlight(&frame_bb,id,1);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)(local_110 - fVar12)),auVar15,2);
  bVar3 = (bool)((byte)uVar1 & 1);
  fVar13 = (float)((uint)bVar3 * (int)fVar13 + (uint)!bVar3 * (int)(local_110 - fVar12));
  if ((flags & 0x40U) == 0) {
    name._4_4_ = frame_bb.Max.y;
    name._0_4_ = fVar13;
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar7->DrawList,&frame_bb.Min,(ImVec2 *)name,IVar6,(pIVar2->Style).FrameRounding,
               rounding_corners);
  }
  if ((flags & 0x20U) == 0) {
    IVar6 = GetColorU32(((byte)(hovered | bVar4) & 1) + 0x15,1.0);
    local_110 = (float)GetColorU32(0,1.0);
    name._4_4_ = frame_bb.Min.y;
    name._0_4_ = fVar13;
    ImDrawList::AddRectFilled
              (pIVar7->DrawList,(ImVec2 *)name,&frame_bb.Max,IVar6,(pIVar2->Style).FrameRounding,
               (uint)(auVar10._0_4_ <= fVar12) * 5 + 10);
    if ((fVar13 + fVar12) - (pIVar2->Style).FramePadding.x <= frame_bb.Max.x) {
      fVar12 = (pIVar2->Style).FramePadding.y;
      auVar15 = vinsertps_avx(ZEXT416((uint)(fVar12 + fVar13)),
                              ZEXT416((uint)(fVar12 + frame_bb.Min.y)),0x10);
      RenderArrow(pIVar7->DrawList,auVar15._0_8_,(ImU32)local_110,3,1.0);
    }
  }
  RenderFrameBorder(frame_bb.Min,frame_bb.Max,(pIVar2->Style).FrameRounding);
  if (preview_value != (char *)0x0 && bVar5 == false) {
    IVar14 = (pIVar2->Style).FramePadding;
    size_expected.x = 0.0;
    size_expected.y = 0.0;
    auVar16._0_4_ = frame_bb.Min.x + IVar14.x;
    auVar16._4_4_ = frame_bb.Min.y + IVar14.y;
    auVar16._8_8_ = 0;
    name._0_8_ = vmovlps_avx(auVar16);
    r_outer.Min.y = frame_bb.Max.y;
    r_outer.Min.x = fVar13;
    RenderTextClipped((ImVec2 *)name,&r_outer.Min,preview_value,(char *)0x0,(ImVec2 *)0x0,
                      &size_expected,(ImRect *)0x0);
  }
  IVar27 = frame_bb;
  auVar23 = ZEXT856(extraout_XMM0_Qb);
  if (0.0 < local_88) {
    auVar23 = (undefined1  [56])0x0;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = frame_bb.Min.y;
    auVar17._4_4_ = frame_bb.Max.x;
    auVar11 = vpermi2ps_avx512vl(_DAT_003e5710,ZEXT416((uint)(pIVar2->Style).FramePadding.y),
                                 ZEXT416((uint)(pIVar2->Style).ItemInnerSpacing.x));
    auVar15 = vshufps_avx(auVar17,auVar17,0xe1);
    IVar14.x = auVar15._0_4_ + auVar11._0_4_;
    IVar14.y = auVar15._4_4_ + auVar11._4_4_;
    frame_bb = IVar27;
    RenderText(IVar14,label,(char *)0x0,true);
  }
  if (local_111 == '\0') {
    if (pIVar2->NavActivateId != id || bVar4) {
      if (!bVar4) {
        return false;
      }
      goto LAB_0020ee9a;
    }
  }
  else if (bVar4) goto LAB_0020ee9a;
  if ((pIVar7->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar7->NavLastIds[0] = id;
  }
  OpenPopupEx(id);
LAB_0020ee9a:
  if ((uVar9 & 0x10) == 0) {
    uVar9 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar9 = flags;
    }
    if ((uVar9 & 4) == 0) {
      if ((uVar9 & 2) == 0) {
        uVar8 = -(uint)((uVar9 & 8) == 0) | 0x14;
      }
      else {
        uVar8 = 4;
      }
    }
    else {
      uVar8 = 8;
    }
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name._0_4_ = auVar10._0_4_;
    fVar12 = CalcMaxPopupHeightFromItemCount(uVar8);
    r_outer.Min.y = fVar12;
    r_outer.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints((ImVec2 *)name,&r_outer.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
    flags = uVar9;
  }
  else {
    *(byte *)&(pIVar2->NextWindowData).Flags = (byte)(pIVar2->NextWindowData).Flags | 0x10;
    fVar12 = (pIVar2->NextWindowData).SizeConstraintRect.Min.x;
    uVar1 = vcmpss_avx512f(auVar10,ZEXT416((uint)fVar12),2);
    bVar5 = (bool)((byte)uVar1 & 1);
    auVar23 = ZEXT856(extraout_var._4_8_);
    (pIVar2->NextWindowData).SizeConstraintRect.Min.x =
         (float)((uint)bVar5 * (int)fVar12 + (uint)!bVar5 * (int)auVar10._0_4_);
  }
  ImFormatString(name,0x10,"##Combo_%02d",(ulong)(uint)(pIVar2->BeginPopupStack).Size);
  pIVar7 = FindWindowByName(name);
  if ((pIVar7 != (ImGuiWindow *)0x0) && (pIVar7->WasActive == true)) {
    auVar18._0_8_ = CalcWindowExpectedSize(pIVar7);
    auVar18._8_56_ = extraout_var_00;
    size_expected = (ImVec2)vmovlps_avx(auVar18._0_16_);
    if ((flags & 1U) != 0) {
      pIVar7->AutoPosLastDirection = 0;
    }
    auVar21 = extraout_var_00;
    IVar27 = GetWindowAllowedExtentRect(pIVar7);
    auVar22._0_8_ = IVar27.Max;
    auVar22._8_56_ = auVar23;
    auVar19._0_8_ = IVar27.Min;
    auVar19._8_56_ = auVar21;
    r_outer = (ImRect)vmovlhps_avx(auVar19._0_16_,auVar22._0_16_);
    auVar15 = vinsertps_avx((undefined1  [16])frame_bb,ZEXT416((uint)frame_bb.Max.y),0x10);
    local_60 = (ImVec2)vmovlps_avx(auVar15);
    auVar20._0_8_ =
         FindBestWindowPosForPopupEx
                   (&local_60,&size_expected,&pIVar7->AutoPosLastDirection,&r_outer,&frame_bb,
                    ImGuiPopupPositionPolicy_ComboBox);
    auVar20._8_56_ = extraout_var_01;
    local_60.x = 0.0;
    local_60.y = 0.0;
    pos = (ImVec2)vmovlps_avx(auVar20._0_16_);
    SetNextWindowPos(&pos,0,&local_60);
  }
  r_outer.Min.y = (pIVar2->Style).WindowPadding.y;
  r_outer.Min.x = (pIVar2->Style).FramePadding.x;
  PushStyleVar(1,&r_outer.Min);
  bVar5 = Begin(name,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar5) {
    EndPopup();
    return bVar5;
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}